

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

list<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_> *
gurkenlaeufer::getScenarios_abi_cxx11_(void)

{
  _Atomic_word *__x;
  IParserStatePtr IVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer *__ptr;
  list<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_> *in_RDI;
  Parser parser;
  __uniq_ptr_impl<gurkenlaeufer::IParserStateFactory,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
  local_58;
  Parser local_50;
  string local_40;
  
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00199b88;
  this[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[1]._M_use_count = 0;
  this[1]._M_weak_count = 0;
  this[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[2]._M_use_count = 0;
  this[2]._M_weak_count = 0;
  this[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ScenarioCollection_00199bd8;
  __x = &this[1]._M_use_count;
  this[2]._vptr__Sp_counted_base = (_func_int **)__x;
  *(_Atomic_word **)&this[1]._M_use_count = __x;
  this[2]._M_use_count = 0;
  this[2]._M_weak_count = 0;
  local_58._M_t.
  super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
  .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl =
       (tuple<gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        )operator_new(0x18);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = 2;
  }
  *(undefined ***)
   local_58._M_t.
   super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
   .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl =
       &PTR__ParserStateFactory_001995d8;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((long)local_58._M_t.
          super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
          .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl + 8) =
       this + 1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((long)local_58._M_t.
          super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
          .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl + 0x10) =
       this;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = this->_M_use_count + 1;
  }
  Parser::Parser(&local_50,(IParserStateFactoryPtr *)&local_58);
  if ((_Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
       )local_58._M_t.
        super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl !=
      (IParserStateFactory *)0x0) {
    (**(code **)(*(long *)local_58._M_t.
                          super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
                          .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>.
                          _M_head_impl + 8))();
  }
  local_58._M_t.
  super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
  .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl =
       (tuple<gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        )(_Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
          )0x0;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"addition.feature","");
  Parser::parseFile(&local_50,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (*(*(_func_int ***)
      local_50._currentState._M_t.
      super___uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
      ._M_t.
      super__Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
      .super__Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>._M_head_impl)[3])();
  IVar1._M_t.
  super___uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
  ._M_t.
  super__Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
  .super__Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>._M_head_impl =
       (__uniq_ptr_data<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>,_true,_true>
        )(__uniq_ptr_data<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>,_true,_true>
          )local_50._currentState;
  local_50._currentState._M_t.
  super___uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
  ._M_t.
  super__Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
  .super__Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>._M_head_impl =
       (__uniq_ptr_data<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>,_true,_true>
        )(__uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
          )0x0;
  if ((_Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>)
      IVar1._M_t.
      super___uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
      ._M_t.
      super__Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
      .super__Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>._M_head_impl !=
      (_Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>)0x0) {
    (*(*(_func_int ***)
        IVar1._M_t.
        super___uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
        ._M_t.
        super__Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
        .super__Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>._M_head_impl)[1])();
  }
  std::__cxx11::list<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_>::list
            (in_RDI,(list<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_> *)__x);
  if ((_Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
       )local_50._currentState._M_t.
        super___uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
        ._M_t.
        super__Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
        .super__Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>._M_head_impl !=
      (IParserState *)0x0) {
    (**(code **)(*(long *)local_50._currentState._M_t.
                          super___uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
                          .super__Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>._M_head_impl
                + 8))();
  }
  local_50._currentState._M_t.
  super___uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
  ._M_t.
  super__Tuple_impl<0UL,_gurkenlaeufer::IParserState_*,_std::default_delete<gurkenlaeufer::IParserState>_>
  .super__Head_base<0UL,_gurkenlaeufer::IParserState_*,_false>._M_head_impl =
       (__uniq_ptr_data<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>,_true,_true>
        )(__uniq_ptr_impl<gurkenlaeufer::IParserState,_std::default_delete<gurkenlaeufer::IParserState>_>
          )0x0;
  if ((tuple<gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
       )local_50._factory._M_t.
        super___uniq_ptr_impl<gurkenlaeufer::IParserStateFactory,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        ._M_t.
        super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl !=
      (_Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_50._factory._M_t.
        super___uniq_ptr_impl<gurkenlaeufer::IParserStateFactory,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        ._M_t.
        super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl)[1])();
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  return in_RDI;
}

Assistant:

std::list<gurkenlaeufer::Scenario> gurkenlaeufer::getScenarios()
{
    auto scenarios = std::make_shared<gurkenlaeufer::ScenarioCollection>();

    Parser parser(IParserStateFactoryPtr(new gurkenlaeufer::ParserStateFactory(scenarios)));
    parser.parseFile("addition.feature");
    parser.finish();

    return scenarios->getScenarios();
}